

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

Triple * __thiscall llvm::Triple::get32BitArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  ArchType AVar1;
  Triple *this_local;
  Triple *T;
  
  Triple(__return_storage_ptr__,this);
  AVar1 = getArch(this);
  switch(AVar1) {
  case UnknownArch:
  case avr:
  case bpfel:
  case bpfeb:
  case msp430:
  case ppc64le:
  case amdgcn:
  case systemz:
    setArch(__return_storage_ptr__,UnknownArch);
    break;
  case arm:
  case armeb:
  case arc:
  case hexagon:
  case mips:
  case mipsel:
  case nios2:
  case ppc:
  case r600:
  case riscv32:
  case sparc:
  case sparcel:
  case tce:
  case tcele:
  case thumb:
  case thumbeb:
  case x86:
  case xcore:
  case nvptx:
  case le32:
  case amdil:
  case hsail:
  case spir:
  case kalimba:
  case shave:
  case lanai:
  case wasm32:
  case renderscript32:
    break;
  case aarch64:
    setArch(__return_storage_ptr__,arm);
    break;
  case aarch64_be:
    setArch(__return_storage_ptr__,armeb);
    break;
  case mips64:
    setArch(__return_storage_ptr__,mips);
    break;
  case mips64el:
    setArch(__return_storage_ptr__,mipsel);
    break;
  case ppc64:
    setArch(__return_storage_ptr__,ppc);
    break;
  case riscv64:
    setArch(__return_storage_ptr__,riscv32);
    break;
  case sparcv9:
    setArch(__return_storage_ptr__,sparc);
    break;
  case x86_64:
    setArch(__return_storage_ptr__,x86);
    break;
  case nvptx64:
    setArch(__return_storage_ptr__,nvptx);
    break;
  case le64:
    setArch(__return_storage_ptr__,le32);
    break;
  case amdil64:
    setArch(__return_storage_ptr__,amdil);
    break;
  case hsail64:
    setArch(__return_storage_ptr__,hsail);
    break;
  case spir64:
    setArch(__return_storage_ptr__,spir);
    break;
  case wasm64:
    setArch(__return_storage_ptr__,wasm32);
    break;
  case LastArchType:
    setArch(__return_storage_ptr__,renderscript32);
  }
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::get32BitArchVariant() const {
  Triple T(*this);
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::amdgcn:
  case Triple::avr:
  case Triple::bpfel:
  case Triple::bpfeb:
  case Triple::msp430:
  case Triple::systemz:
  case Triple::ppc64le:
    T.setArch(UnknownArch);
    break;

  case Triple::amdil:
  case Triple::hsail:
  case Triple::spir:
  case Triple::arc:
  case Triple::arm:
  case Triple::armeb:
  case Triple::hexagon:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::mips:
  case Triple::mipsel:
  case Triple::nios2:
  case Triple::nvptx:
  case Triple::ppc:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::sparc:
  case Triple::sparcel:
  case Triple::tce:
  case Triple::tcele:
  case Triple::thumb:
  case Triple::thumbeb:
  case Triple::x86:
  case Triple::xcore:
  case Triple::lanai:
  case Triple::shave:
  case Triple::wasm32:
  case Triple::renderscript32:
    // Already 32-bit.
    break;

  case Triple::aarch64:        T.setArch(Triple::arm);     break;
  case Triple::aarch64_be:     T.setArch(Triple::armeb);   break;
  case Triple::le64:           T.setArch(Triple::le32);    break;
  case Triple::mips64:         T.setArch(Triple::mips);    break;
  case Triple::mips64el:       T.setArch(Triple::mipsel);  break;
  case Triple::nvptx64:        T.setArch(Triple::nvptx);   break;
  case Triple::ppc64:          T.setArch(Triple::ppc);     break;
  case Triple::sparcv9:        T.setArch(Triple::sparc);   break;
  case Triple::riscv64:        T.setArch(Triple::riscv32); break;
  case Triple::x86_64:         T.setArch(Triple::x86);     break;
  case Triple::amdil64:        T.setArch(Triple::amdil);   break;
  case Triple::hsail64:        T.setArch(Triple::hsail);   break;
  case Triple::spir64:         T.setArch(Triple::spir);    break;
  case Triple::wasm64:         T.setArch(Triple::wasm32);  break;
  case Triple::renderscript64: T.setArch(Triple::renderscript32); break;
  }
  return T;
}